

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

void __thiscall Map::SpellGroup(Map *this,Character *from,unsigned_short spell_id)

{
  _Rb_tree_header *p_Var1;
  short sVar2;
  Character *this_00;
  World *pWVar3;
  bool bVar4;
  bool bVar5;
  int num;
  uint uVar6;
  int iVar7;
  mapped_type *pmVar8;
  _Base_ptr p_Var9;
  undefined6 in_register_00000012;
  list<Character_*,_std::allocator<Character_*>_> *__range2;
  pointer ppCVar10;
  uint uVar11;
  _List_node_base *p_Var12;
  Character *character;
  PacketBuilder builder;
  set<Character_*,_std::less<Character_*>,_std::allocator<Character_*>_> in_range;
  undefined1 local_108 [32];
  Character *local_e8;
  key_type local_e0;
  ESF_Data *local_c0;
  pointer local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  PacketBuilder local_90;
  _Rb_tree<Character_*,_Character_*,_std::_Identity<Character_*>,_std::less<Character_*>,_std::allocator<Character_*>_>
  local_60;
  
  uVar11 = (uint)CONCAT62(in_register_00000012,spell_id);
  local_c0 = ESF::Get(from->world->esf,uVar11);
  if (local_c0->id == 0) {
    return;
  }
  if (local_c0->type != Heal) {
    return;
  }
  if (from->party == (Party *)0x0) {
    return;
  }
  if (from->tp < (int)local_c0->tp) {
    return;
  }
  from->tp = from->tp - (int)local_c0->tp;
  sVar2 = local_c0->hp;
  if ((from->nointeract & 4U) != 0) {
    if ((from->nointeract & 0x20U) != 0) {
      bVar5 = true;
      bVar4 = false;
      goto LAB_001771d1;
    }
    if (from->map->pk == false) {
      pWVar3 = this->world;
      local_b0._M_allocated_capacity = (size_type)&local_a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"GlobalPK","");
      pmVar8 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar3->config,(key_type *)&local_b0);
      bVar5 = util::variant::GetBool(pmVar8);
      bVar4 = true;
      if (bVar5) {
        bVar5 = World::PKExcept(this->world,(int)this->id);
      }
      else {
        bVar5 = true;
      }
      goto LAB_001771d1;
    }
  }
  bVar4 = false;
  bVar5 = false;
LAB_001771d1:
  if ((bVar4) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_allocated_capacity != &local_a0)) {
    operator_delete((void *)local_b0._M_allocated_capacity,local_a0._M_allocated_capacity + 1);
  }
  iVar7 = 1;
  if (sVar2 < 1) {
    iVar7 = (int)sVar2;
  }
  if (bVar5 == false) {
    iVar7 = (int)sVar2;
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  PacketBuilder::PacketBuilder
            (&local_90,PACKET_SPELL,PACKET_TARGET_GROUP,
             ((long)(from->party->members).
                    super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(from->party->members).
                    super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * 10 + 8);
  PacketBuilder::AddShort(&local_90,uVar11);
  num = Character::PlayerID(from);
  PacketBuilder::AddShort(&local_90,num);
  PacketBuilder::AddShort(&local_90,from->tp);
  PacketBuilder::AddShort(&local_90,iVar7);
  ppCVar10 = (from->party->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_b8 = (from->party->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar10 != local_b8) {
    local_e8 = from;
    do {
      this_00 = *ppCVar10;
      if (this_00->map == from->map) {
        uVar11 = (uint)local_c0->hp;
        pWVar3 = this->world;
        local_108._0_8_ = local_108 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"LimitDamage","");
        pmVar8 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&pWVar3->config,(key_type *)local_108);
        bVar4 = util::variant::GetBool(pmVar8);
        if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
          operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
        }
        if ((bVar4) && (uVar6 = this_00->maxhp - this_00->hp, (int)uVar6 < (int)uVar11)) {
          uVar11 = uVar6;
        }
        bVar4 = false;
        uVar6 = 0;
        if (0 < (int)uVar11) {
          uVar6 = uVar11;
        }
        bVar5 = false;
        if ((local_e8->nointeract & 4U) != 0) {
          if ((local_e8->nointeract & 0x20U) == 0) {
            if (local_e8->map->pk == false) {
              pWVar3 = this->world;
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"GlobalPK","");
              pmVar8 = std::__detail::
                       _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&pWVar3->config,&local_e0);
              bVar5 = util::variant::GetBool(pmVar8);
              bVar4 = true;
              if (bVar5) {
                bVar5 = World::PKExcept(this->world,(int)this->id);
                bVar4 = true;
              }
              else {
                bVar5 = true;
              }
            }
            else {
              bVar4 = false;
              bVar5 = false;
            }
          }
          else {
            bVar5 = true;
            bVar4 = false;
          }
        }
        if ((bVar4) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2)) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        if (bVar5 != false) {
          uVar6 = (uint)(0 < (int)uVar11);
        }
        this_00->hp = this_00->hp + uVar6;
        pWVar3 = this->world;
        local_108._0_8_ = local_108 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"LimitDamage","");
        pmVar8 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&pWVar3->config,(key_type *)local_108);
        from = local_e8;
        bVar4 = util::variant::GetBool(pmVar8);
        if ((Character *)local_108._0_8_ != (Character *)(local_108 + 0x10)) {
          operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
        }
        if (!bVar4) {
          iVar7 = this_00->hp;
          if (this_00->maxhp < this_00->hp) {
            iVar7 = this_00->maxhp;
          }
          this_00->hp = iVar7;
        }
        PacketBuilder::AddByte(&local_90,0xff);
        PacketBuilder::AddByte(&local_90,0xff);
        PacketBuilder::AddByte(&local_90,0xff);
        PacketBuilder::AddByte(&local_90,0xff);
        PacketBuilder::AddByte(&local_90,0xff);
        iVar7 = Character::PlayerID(this_00);
        PacketBuilder::AddShort(&local_90,iVar7);
        iVar7 = (int)(((double)this_00->hp / (double)this_00->maxhp) * 100.0);
        if (iVar7 < 1) {
          iVar7 = 0;
        }
        if (99 < iVar7) {
          iVar7 = 100;
        }
        PacketBuilder::AddChar(&local_90,iVar7);
        PacketBuilder::AddShort(&local_90,this_00->hp);
        for (p_Var12 = (this->characters).
                       super__List_base<Character_*,_std::allocator<Character_*>_>._M_impl._M_node.
                       super__List_node_base._M_next;
            p_Var12 != (_List_node_base *)&this->characters; p_Var12 = p_Var12->_M_next) {
          local_108._0_8_ = p_Var12[1]._M_next;
          bVar4 = Character::InRange(this_00,(Character *)local_108._0_8_);
          if (bVar4) {
            std::
            _Rb_tree<Character*,Character*,std::_Identity<Character*>,std::less<Character*>,std::allocator<Character*>>
            ::_M_insert_unique<Character*const&>
                      ((_Rb_tree<Character*,Character*,std::_Identity<Character*>,std::less<Character*>,std::allocator<Character*>>
                        *)&local_60,(Character **)local_108);
          }
        }
      }
      ppCVar10 = ppCVar10 + 1;
    } while (ppCVar10 != local_b8);
  }
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    p_Var9 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      Character::Send(*(Character **)(p_Var9 + 1),&local_90);
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != p_Var1);
  }
  PacketBuilder::~PacketBuilder(&local_90);
  std::
  _Rb_tree<Character_*,_Character_*,_std::_Identity<Character_*>,_std::less<Character_*>,_std::allocator<Character_*>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void Map::SpellGroup(Character *from, unsigned short spell_id)
{
	const ESF_Data& spell = from->world->esf->Get(spell_id);

	if (!spell || spell.type != ESF::Heal || !from->party || from->tp < spell.tp)
		return;

	from->tp -= spell.tp;

	int displayhp = spell.hp;

	if (!from->CanInteractCombat() && !(from->CanInteractPKCombat() && (from->map->pk || (this->world->config["GlobalPK"] && !this->world->PKExcept(this->id)))))
	{
		displayhp = std::min(displayhp, 1);
	}

	std::set<Character *> in_range;

	PacketBuilder builder(PACKET_SPELL, PACKET_TARGET_GROUP, 8 + from->party->members.size() * 10);
	builder.AddShort(spell_id);
	builder.AddShort(from->PlayerID());
	builder.AddShort(from->tp);
	builder.AddShort(displayhp);

	UTIL_FOREACH(from->party->members, member)
	{
		if (member->map != from->map)
			continue;

		int displayhp = spell.hp;
		int hpgain = spell.hp;

		if (this->world->config["LimitDamage"])
			hpgain = std::min(hpgain, member->maxhp - member->hp);

		hpgain = std::max(hpgain, 0);

		if (!from->CanInteractCombat() && !(from->CanInteractPKCombat() && (from->map->pk || (this->world->config["GlobalPK"] && !this->world->PKExcept(this->id)))))
			hpgain = std::min(hpgain, 1);

		member->hp += hpgain;

		if (!this->world->config["LimitDamage"])
			member->hp = std::min(member->hp, member->maxhp);

		// wat?
		builder.AddByte(255);
		builder.AddByte(255);
		builder.AddByte(255);
		builder.AddByte(255);
		builder.AddByte(255);

		builder.AddShort(member->PlayerID());
		builder.AddChar(util::clamp<int>(double(member->hp) / double(member->maxhp) * 100.0, 0, 100));
		builder.AddShort(member->hp);

		UTIL_FOREACH(this->characters, character)
		{
			if (member->InRange(character))
				in_range.insert(character);
		}
	}

	UTIL_FOREACH(in_range, character)
	{
		character->Send(builder);
	}
}